

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O0

int mriStep_SetLinear(ARKodeMem ark_mem,int timedepend)

{
  int in_ESI;
  int retval;
  ARKodeMRIStepMem step_mem;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  char *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  local_4 = mriStep_AccessStepMem
                      ((ARKodeMem)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                       in_stack_ffffffffffffffe0,
                       (ARKodeMRIStepMem *)
                       CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (local_4 == 0) {
    in_stack_ffffffffffffffe0[0x10] = '\x01';
    in_stack_ffffffffffffffe0[0x11] = '\0';
    in_stack_ffffffffffffffe0[0x12] = '\0';
    in_stack_ffffffffffffffe0[0x13] = '\0';
    *(uint *)(in_stack_ffffffffffffffe0 + 0x14) = (uint)(in_ESI == 1);
    *(undefined1 **)(in_stack_ffffffffffffffe0 + 0xd8) = &DAT_3d19000000000000;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mriStep_SetLinear(ARKodeMem ark_mem, int timedepend)
{
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* set parameters */
  step_mem->linear         = SUNTRUE;
  step_mem->linear_timedep = (timedepend == 1);
  step_mem->dgmax          = SUN_RCONST(100.0) * SUN_UNIT_ROUNDOFF;

  return (ARK_SUCCESS);
}